

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_metric.c
# Opt level: O1

REF_STATUS
ref_metric_cons_viscous_g
          (REF_DBL *g,REF_GRID ref_grid,REF_INT ldim,REF_DBL *prim_dual,REF_DBL mach,REF_DBL re,
          REF_DBL reference_temp,REF_RECON_RECONSTRUCTION reconstruction)

{
  size_t __size;
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  REF_NODE pRVar5;
  REF_GLOB *pRVar6;
  bool bVar7;
  int iVar8;
  uint uVar9;
  undefined4 extraout_var;
  REF_DBL *scalar;
  double *pdVar10;
  ulong uVar11;
  undefined8 unaff_RBX;
  undefined7 uVar12;
  uint unaff_EBP;
  REF_DBL *pRVar13;
  long lVar14;
  long lVar15;
  int iVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  REF_DBL mu;
  REF_DBL mu_t;
  REF_DBL *local_c0;
  double local_a8;
  REF_DBL *local_a0;
  REF_DBL *local_98;
  REF_DBL *local_90;
  REF_DBL local_88;
  REF_DBL local_80;
  REF_DBL *local_78;
  long local_70;
  double local_68;
  REF_DBL local_60;
  REF_DBL local_58;
  double local_50;
  REF_DBL local_48;
  undefined8 uStack_40;
  
  pRVar5 = ref_grid->node;
  uVar9 = pRVar5->max;
  local_88 = re;
  local_80 = mach;
  local_58 = reference_temp;
  if ((int)uVar9 < 0) {
    bVar7 = false;
    uVar12 = 0;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xbca,
           "ref_metric_cons_viscous_g","malloc rhou1star of REF_DBL negative");
    unaff_EBP = 1;
  }
  else {
    local_90 = (REF_DBL *)malloc((ulong)uVar9 * 0x30);
    if (local_90 == (REF_DBL *)0x0) {
      bVar7 = false;
      uVar12 = 0;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xbca,"ref_metric_cons_viscous_g","malloc rhou1star of REF_DBL NULL");
      unaff_EBP = 2;
      local_90 = (REF_DBL *)0x0;
    }
    else {
      uVar12 = (undefined7)((ulong)unaff_RBX >> 8);
      bVar7 = true;
      if ((ulong)uVar9 != 0) {
        uVar11 = 1;
        if (1 < (int)(uVar9 * 6)) {
          uVar11 = (ulong)(uVar9 * 6);
        }
        memset(local_90,0,uVar11 << 3);
      }
    }
  }
  if (!bVar7) {
    return unaff_EBP;
  }
  uVar9 = pRVar5->max;
  if ((int)uVar9 < 0) {
    bVar7 = false;
    uVar12 = 0;
    iVar8 = printf("%s: %d: %s: %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xbcb,"ref_metric_cons_viscous_g","malloc rhou2star of REF_DBL negative");
    local_78 = (REF_DBL *)CONCAT44(extraout_var,iVar8);
    unaff_EBP = 1;
  }
  else {
    local_78 = (REF_DBL *)malloc((ulong)uVar9 * 0x30);
    if (local_78 == (REF_DBL *)0x0) {
      bVar7 = false;
      uVar12 = 0;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xbcb,"ref_metric_cons_viscous_g","malloc rhou2star of REF_DBL NULL");
      unaff_EBP = 2;
      local_78 = (REF_DBL *)0x0;
    }
    else {
      bVar7 = true;
      if ((ulong)uVar9 != 0) {
        uVar11 = 1;
        if (1 < (int)(uVar9 * 6)) {
          uVar11 = (ulong)(uVar9 * 6);
        }
        memset(local_78,0,uVar11 << 3);
      }
    }
  }
  if (!bVar7) {
    return unaff_EBP;
  }
  uVar9 = pRVar5->max;
  if ((int)uVar9 < 0) {
    bVar7 = false;
    uVar12 = 0;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xbcc,
           "ref_metric_cons_viscous_g","malloc rhou3star of REF_DBL negative");
    unaff_EBP = 1;
  }
  else {
    local_98 = (REF_DBL *)malloc((ulong)uVar9 * 0x30);
    if (local_98 == (REF_DBL *)0x0) {
      local_98 = (REF_DBL *)0x0;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xbcc,"ref_metric_cons_viscous_g","malloc rhou3star of REF_DBL NULL");
      unaff_EBP = 2;
      bVar7 = false;
      uVar12 = 0;
    }
    else {
      bVar7 = true;
      if ((ulong)uVar9 != 0) {
        uVar11 = 1;
        if (1 < (int)(uVar9 * 6)) {
          uVar11 = (ulong)(uVar9 * 6);
        }
        memset(local_98,0,uVar11 << 3);
      }
    }
  }
  if (!bVar7) {
    return unaff_EBP;
  }
  uVar9 = pRVar5->max;
  if ((int)uVar9 < 0) {
    scalar = (REF_DBL *)0x0;
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xbcd,
           "ref_metric_cons_viscous_g","malloc rhoestar of REF_DBL negative");
    unaff_EBP = 1;
  }
  else {
    local_a0 = (REF_DBL *)malloc((ulong)uVar9 * 0x30);
    if (local_a0 == (REF_DBL *)0x0) {
      local_a0 = (REF_DBL *)0x0;
      printf("%s: %d: %s: %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xbcd,"ref_metric_cons_viscous_g","malloc rhoestar of REF_DBL NULL");
      unaff_EBP = 2;
      scalar = (REF_DBL *)0x0;
    }
    else {
      scalar = (REF_DBL *)CONCAT71(uVar12,1);
      if ((ulong)uVar9 != 0) {
        uVar11 = 1;
        if (1 < (int)(uVar9 * 6)) {
          uVar11 = (ulong)(uVar9 * 6);
        }
        memset(local_a0,0,uVar11 << 3);
      }
    }
  }
  if ((char)scalar == '\0') {
    return unaff_EBP;
  }
  iVar8 = pRVar5->max;
  if ((long)iVar8 < 0) {
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xbce,
           "ref_metric_cons_viscous_g","malloc lam of REF_DBL negative");
    unaff_EBP = 1;
  }
  else {
    __size = (long)iVar8 * 8;
    scalar = (REF_DBL *)malloc(__size);
    if (scalar != (REF_DBL *)0x0) {
      if (iVar8 != 0) {
        memset(scalar,0,__size);
      }
      bVar7 = true;
      goto LAB_0019cdc4;
    }
    printf("%s: %d: %s: %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",0xbce,
           "ref_metric_cons_viscous_g","malloc lam of REF_DBL NULL");
    unaff_EBP = 2;
    scalar = (REF_DBL *)0x0;
  }
  bVar7 = false;
LAB_0019cdc4:
  if (bVar7) {
    iVar16 = ldim / 2;
    iVar8 = pRVar5->max;
    if (0 < (long)iVar8) {
      pRVar6 = pRVar5->global;
      pRVar13 = prim_dual + (long)iVar16 + 1;
      lVar14 = 0;
      do {
        if (-1 < pRVar6[lVar14]) {
          scalar[lVar14] = *pRVar13;
        }
        lVar14 = lVar14 + 1;
        pRVar13 = pRVar13 + ldim;
      } while (iVar8 != lVar14);
    }
    unaff_EBP = ref_recon_signed_hessian(ref_grid,scalar,local_90,reconstruction);
    if (unaff_EBP == 0) {
      iVar8 = pRVar5->max;
      if (0 < (long)iVar8) {
        pRVar6 = pRVar5->global;
        pRVar13 = prim_dual + (long)iVar16 + 2;
        lVar14 = 0;
        do {
          if (-1 < pRVar6[lVar14]) {
            scalar[lVar14] = *pRVar13;
          }
          lVar14 = lVar14 + 1;
          pRVar13 = pRVar13 + ldim;
        } while (iVar8 != lVar14);
      }
      unaff_EBP = ref_recon_signed_hessian(ref_grid,scalar,local_78,reconstruction);
      if (unaff_EBP == 0) {
        iVar8 = pRVar5->max;
        if (0 < (long)iVar8) {
          pRVar6 = pRVar5->global;
          pRVar13 = prim_dual + (long)iVar16 + 3;
          lVar14 = 0;
          do {
            if (-1 < pRVar6[lVar14]) {
              scalar[lVar14] = *pRVar13;
            }
            lVar14 = lVar14 + 1;
            pRVar13 = pRVar13 + ldim;
          } while (iVar8 != lVar14);
        }
        unaff_EBP = ref_recon_signed_hessian(ref_grid,scalar,local_98,reconstruction);
        if (unaff_EBP == 0) {
          iVar8 = pRVar5->max;
          if (0 < (long)iVar8) {
            pRVar6 = pRVar5->global;
            pRVar13 = prim_dual + (long)iVar16 + 4;
            lVar14 = 0;
            do {
              if (-1 < pRVar6[lVar14]) {
                scalar[lVar14] = *pRVar13;
              }
              lVar14 = lVar14 + 1;
              pRVar13 = pRVar13 + ldim;
            } while (iVar8 != lVar14);
          }
          unaff_EBP = ref_recon_signed_hessian(ref_grid,scalar,local_a0,reconstruction);
          if (unaff_EBP == 0) {
            if (scalar != (REF_DBL *)0x0) {
              free(scalar);
            }
            if (0 < pRVar5->max) {
              local_c0 = prim_dual + 5;
              local_80 = local_80 / local_88;
              pdVar10 = g + 4;
              local_70 = (long)ldim << 3;
              lVar15 = 5;
              lVar14 = 0;
              do {
                if (-1 < pRVar5->global[lVar14]) {
                  local_88 = local_c0[-5];
                  local_48 = local_c0[-4];
                  uStack_40 = 0;
                  dVar1 = local_c0[-3];
                  local_60 = local_c0[-2];
                  local_68 = local_c0[-1] / 0.3999999999999999;
                  dVar18 = local_88 * 0.5;
                  uVar9 = viscosity_law((local_c0[-1] * 1.4) / local_88,local_58,&local_a8);
                  if (uVar9 != 0) {
                    printf("%s: %d: %s: %d %s\n",
                           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                           ,0xbee,"ref_metric_cons_viscous_g",(ulong)uVar9,"sutherlands");
                    return uVar9;
                  }
                  dVar22 = local_a8 / 0.2879999999999999;
                  if ((ldim & 0xfffffffeU) == 0xc) {
                    uVar9 = ref_phys_mut_sa(*local_c0,local_88,local_a8 / local_88,&local_50);
                    if (uVar9 != 0) {
                      printf("%s: %d: %s: %d %s\n",
                             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                             ,0xbf2,"ref_metric_cons_viscous_g",(ulong)uVar9,"eddy viscosity");
                      return uVar9;
                    }
                    dVar22 = local_a8 / 0.2879999999999999;
                    local_a8 = local_a8 + local_50;
                    dVar22 = local_50 / 0.35999999999999993 + dVar22;
                  }
                  dVar17 = local_60 * local_60 + local_48 * local_48 + dVar1 * dVar1;
                  local_a8 = local_a8 * local_80;
                  dVar2 = local_a0[lVar15 + -2];
                  dVar3 = local_a0[lVar15 + -5];
                  dVar4 = local_a0[lVar15];
                  dVar20 = (local_a8 * 0.3333333333333333) / local_88;
                  dVar19 = (local_60 * local_a0[lVar15 + -3] +
                            dVar1 * local_a0[lVar15 + -4] +
                            local_48 * 3.0 * dVar4 + local_48 * 4.0 * dVar3 + local_48 * 3.0 * dVar2
                           + local_90[lVar15] * 3.0 +
                             local_90[lVar15 + -5] * 4.0 + local_90[lVar15 + -2] * 3.0 +
                             local_78[lVar15 + -4] + local_98[lVar15 + -3]) * dVar20;
                  dVar21 = (local_60 * local_a0[lVar15 + -1] +
                            dVar1 * 3.0 * dVar4 +
                            dVar1 * 4.0 * dVar2 +
                            local_a0[lVar15 + -4] * local_48 + dVar1 * 3.0 * dVar3 +
                           local_78[lVar15] * 3.0 +
                           local_78[lVar15 + -2] * 4.0 +
                           local_78[lVar15 + -5] * 3.0 + local_90[lVar15 + -4] +
                           local_98[lVar15 + -1]) * dVar20;
                  dVar20 = (local_60 * 4.0 * dVar4 +
                            local_60 * 3.0 * dVar2 +
                            local_60 * 3.0 * dVar3 +
                            local_a0[lVar15 + -3] * local_48 + local_a0[lVar15 + -1] * dVar1 +
                           local_98[lVar15] * 4.0 +
                           local_98[lVar15 + -2] * 3.0 +
                           local_98[lVar15 + -5] * 3.0 +
                           local_90[lVar15 + -3] + local_78[lVar15 + -1]) * dVar20;
                  dVar22 = ((dVar22 * local_80) / local_88) * (dVar3 + dVar2 + dVar4);
                  pdVar10[-4] = (dVar17 - (dVar18 * dVar17 + local_68) / local_88) * dVar22 +
                                ((-local_48 * dVar19 - dVar21 * dVar1) - local_60 * dVar20) +
                                pdVar10[-4];
                  pdVar10[-3] = (dVar19 - local_48 * dVar22) + pdVar10[-3];
                  pdVar10[-2] = (dVar21 - dVar1 * dVar22) + pdVar10[-2];
                  pdVar10[-1] = (dVar20 - local_60 * dVar22) + pdVar10[-1];
                  *pdVar10 = dVar22 + *pdVar10;
                }
                lVar14 = lVar14 + 1;
                pdVar10 = pdVar10 + 5;
                lVar15 = lVar15 + 6;
                local_c0 = (REF_DBL *)((long)local_c0 + local_70);
              } while (lVar14 < pRVar5->max);
            }
            if (local_a0 != (REF_DBL *)0x0) {
              free(local_a0);
            }
            if (local_98 != (REF_DBL *)0x0) {
              free(local_98);
            }
            if (local_78 != (REF_DBL *)0x0) {
              free(local_78);
            }
            unaff_EBP = 0;
            if (local_90 != (REF_DBL *)0x0) {
              free(local_90);
            }
          }
          else {
            printf("%s: %d: %s: %d %s\n",
                   "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c"
                   ,0xbe3,"ref_metric_cons_viscous_g",(ulong)unaff_EBP,"h4");
          }
        }
        else {
          printf("%s: %d: %s: %d %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
                 0xbde,"ref_metric_cons_viscous_g",(ulong)unaff_EBP,"h3");
        }
      }
      else {
        printf("%s: %d: %s: %d %s\n",
               "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
               0xbd9,"ref_metric_cons_viscous_g",(ulong)unaff_EBP,"h2");
      }
    }
    else {
      printf("%s: %d: %s: %d %s\n",
             "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_metric.c",
             0xbd4,"ref_metric_cons_viscous_g",(ulong)unaff_EBP,"h1");
    }
  }
  return unaff_EBP;
}

Assistant:

REF_FCN REF_STATUS ref_metric_cons_viscous_g(
    REF_DBL *g, REF_GRID ref_grid, REF_INT ldim, REF_DBL *prim_dual,
    REF_DBL mach, REF_DBL re, REF_DBL reference_temp,
    REF_RECON_RECONSTRUCTION reconstruction) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_INT var, node;
  REF_INT nequ;
  REF_DBL *lam, *rhou1star, *rhou2star, *rhou3star, *rhoestar;
  REF_DBL gamma = 1.4;
  REF_DBL t, mu, u1, u2, u3, q2, e;
  REF_DBL pr = 0.72;
  REF_DBL turbulent_pr = 0.90;
  REF_DBL thermal_conductivity;
  REF_DBL rho, turb, mu_t;
  REF_DBL frhou1, frhou2, frhou3, frhoe;
  REF_INT xx = 0, xy = 1, xz = 2, yy = 3, yz = 4, zz = 5;

  nequ = ldim / 2;

  ref_malloc_init(rhou1star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhou2star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhou3star, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(rhoestar, 6 * ref_node_max(ref_node), REF_DBL, 0.0);
  ref_malloc_init(lam, ref_node_max(ref_node), REF_DBL, 0.0);

  var = 1;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou1star, reconstruction), "h1");
  var = 2;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou2star, reconstruction), "h2");
  var = 3;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhou3star, reconstruction), "h3");
  var = 4;
  each_ref_node_valid_node(ref_node, node) {
    lam[node] = prim_dual[var + 1 * nequ + ldim * node];
  }
  RSS(ref_recon_signed_hessian(ref_grid, lam, rhoestar, reconstruction), "h4");
  ref_free(lam);

  each_ref_node_valid_node(ref_node, node) {
    rho = prim_dual[0 + ldim * node];
    u1 = prim_dual[1 + ldim * node];
    u2 = prim_dual[2 + ldim * node];
    u3 = prim_dual[3 + ldim * node];
    q2 = u1 * u1 + u2 * u2 + u3 * u3;
    e = prim_dual[4 + ldim * node] / (gamma - 1.0) + 0.5 * rho * q2;
    t = gamma * prim_dual[4 + ldim * node] / prim_dual[0 + ldim * node];
    RSS(viscosity_law(t, reference_temp, &mu), "sutherlands");
    thermal_conductivity = mu / (pr * (gamma - 1.0));
    if (6 == nequ) {
      turb = prim_dual[5 + ldim * node];
      RSS(ref_phys_mut_sa(turb, rho, mu / rho, &mu_t), "eddy viscosity");
      thermal_conductivity =
          (mu / (pr * (gamma - 1.0)) + mu_t / (turbulent_pr * (gamma - 1.0)));
      mu += mu_t;
    }
    mu *= mach / re;
    thermal_conductivity *= mach / re;

    frhou1 = 4.0 * rhou1star[xx + 6 * node] + 3.0 * rhou1star[yy + 6 * node] +
             3.0 * rhou1star[zz + 6 * node] + rhou2star[xy + 6 * node] +
             rhou3star[xz + 6 * node];
    frhou1 += 4.0 * u1 * rhoestar[xx + 6 * node] +
              3.0 * u1 * rhoestar[yy + 6 * node] +
              3.0 * u1 * rhoestar[zz + 6 * node] +
              u2 * rhoestar[xy + 6 * node] + u3 * rhoestar[xz + 6 * node];
    frhou1 *= (1.0 / 3.0) * mu / rho;

    frhou2 = rhou1star[xy + 6 * node] + 3.0 * rhou2star[xx + 6 * node] +
             4.0 * rhou2star[yy + 6 * node] + 3.0 * rhou2star[zz + 6 * node] +
             rhou3star[yz + 6 * node];
    frhou2 += u1 * rhoestar[xy + 6 * node] +
              3.0 * u2 * rhoestar[xx + 6 * node] +
              4.0 * u2 * rhoestar[yy + 6 * node] +
              3.0 * u2 * rhoestar[zz + 6 * node] + u3 * rhoestar[yz + 6 * node];
    frhou2 *= (1.0 / 3.0) * mu / rho;

    frhou3 = rhou1star[xz + 6 * node] + rhou2star[yz + 6 * node] +
             3.0 * rhou3star[xx + 6 * node] + 3.0 * rhou3star[yy + 6 * node] +
             4.0 * rhou3star[zz + 6 * node];
    frhou3 += u1 * rhoestar[xz + 6 * node] + u2 * rhoestar[yz + 6 * node] +
              3.0 * u3 * rhoestar[xx + 6 * node] +
              3.0 * u3 * rhoestar[yy + 6 * node] +
              4.0 * u3 * rhoestar[zz + 6 * node];
    frhou3 *= (1.0 / 3.0) * mu / rho;

    frhoe = rhoestar[xx + 6 * node] + rhoestar[yy + 6 * node] +
            rhoestar[zz + 6 * node];
    frhoe *= thermal_conductivity / rho;
    /* fun3d e has density in it */
    g[0 + 5 * node] +=
        -u1 * frhou1 - u2 * frhou2 - u3 * frhou3 + (q2 - e / rho) * frhoe;
    g[1 + 5 * node] += frhou1 - u1 * frhoe;
    g[2 + 5 * node] += frhou2 - u2 * frhoe;
    g[3 + 5 * node] += frhou3 - u3 * frhoe;
    g[4 + 5 * node] += frhoe;
  }

  ref_free(rhoestar);
  ref_free(rhou3star);
  ref_free(rhou2star);
  ref_free(rhou1star);

  return REF_SUCCESS;
}